

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O2

int __thiscall CLineInput::OffsetFromActualToDisplay(CLineInput *this,int ActualOffset)

{
  int iVar1;
  int iVar2;
  int cursor;
  int iVar3;
  bool bVar4;
  
  iVar3 = ActualOffset;
  if (this->m_Hidden == true) {
    iVar1 = 0;
    cursor = 0;
    do {
      iVar3 = iVar1;
      if (ActualOffset <= cursor) {
        return iVar3;
      }
      iVar2 = str_utf8_forward(this->m_pStr,cursor);
      bVar4 = iVar2 != cursor;
      iVar1 = iVar3 + 1;
      cursor = iVar2;
    } while (bVar4);
  }
  return iVar3;
}

Assistant:

int CLineInput::OffsetFromActualToDisplay(int ActualOffset) const
{
	if(!IsHidden())
		return ActualOffset;
	int DisplayOffset = 0;
	int CurrentOffset = 0;
	while(CurrentOffset < ActualOffset)
	{
		const int PrevOffset = CurrentOffset;
		CurrentOffset = str_utf8_forward(m_pStr, CurrentOffset);
		if(CurrentOffset == PrevOffset)
			break;
		DisplayOffset++;
	}
	return DisplayOffset;
}